

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O3

Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_> * __thiscall
llvm::DWARFUnit::determineStringOffsetsTableContribution
          (Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_> *__return_storage_ptr__
          ,DWARFUnit *this,DWARFDataExtractor *DA)

{
  undefined1 auVar1 [8];
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 Offset;
  Optional<unsigned_long> OVar2;
  DWARFDie local_78;
  undefined1 auStack_68 [8];
  Expected<llvm::StrOffsetsContributionDescriptor> DescOrError;
  bool local_38;
  Error local_30;
  
  if (this->IsDWO == true) {
    if ((DA->super_DataExtractor).Data.Data != (char *)0x0) {
      Offset.value = 0;
LAB_00b04689:
      parseDWARFStringOffsetsTableHeader
                ((Expected<llvm::StrOffsetsContributionDescriptor> *)auStack_68,DA,
                 (this->Header).FormParams.Format,Offset.value);
      auVar1 = auStack_68;
      if ((DescOrError.field_0.TStorage.buffer[0x10] & 1U) == 0) {
        __return_storage_ptr__->field_0x20 = __return_storage_ptr__->field_0x20 & 0xfe;
        *(undefined1 (*) [8])&__return_storage_ptr__->field_0 = auStack_68;
        *(AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
          *)((AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
              *)((long)&__return_storage_ptr__->field_0 + 8))->buffer =
             DescOrError.field_0.ErrorStorage.buffer;
        *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x10) = DescOrError.field_0._8_8_;
        (__return_storage_ptr__->field_0).TStorage.buffer[0x18] = '\x01';
      }
      else {
        auStack_68 = (undefined1  [8])0x0;
        local_30.Payload = (ErrorInfoBase *)((ulong)auVar1 | 1);
        Expected<llvm::Optional<llvm::StrOffsetsContributionDescriptor>_>::Expected
                  (__return_storage_ptr__,&local_30);
        if ((long *)((ulong)local_30.Payload & 0xfffffffffffffffe) != (long *)0x0) {
          (**(code **)(*(long *)((ulong)local_30.Payload & 0xfffffffffffffffe) + 8))();
        }
      }
      if ((DescOrError.field_0.TStorage.buffer[0x10] & 1U) == 0) {
        return __return_storage_ptr__;
      }
      if (auStack_68 == (undefined1  [8])0x0) {
        return __return_storage_ptr__;
      }
      (**(code **)(*(long *)auStack_68 + 8))();
      return __return_storage_ptr__;
    }
  }
  else {
    local_78 = getUnitDIE(this,true);
    DWARFDie::find((Optional<llvm::DWARFFormValue> *)auStack_68,&local_78,DW_AT_str_offsets_base);
    if (local_38 != false) {
      OVar2 = DWARFFormValue::getAsSectionOffset((DWARFFormValue *)auStack_68);
      Offset = OVar2.Storage.field_0;
      if (((undefined1  [16])OVar2.Storage & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_00b04689;
    }
  }
  __return_storage_ptr__->field_0x20 = __return_storage_ptr__->field_0x20 & 0xfe;
  (__return_storage_ptr__->field_0).TStorage.buffer[0] = '\0';
  (__return_storage_ptr__->field_0).TStorage.buffer[0x18] = '\0';
  return __return_storage_ptr__;
}

Assistant:

Expected<Optional<StrOffsetsContributionDescriptor>>
DWARFUnit::determineStringOffsetsTableContribution(DWARFDataExtractor &DA) {
  uint64_t Offset;
  if (IsDWO) {
    Offset = 0;
    if (DA.getData().data() == nullptr)
      return None;
  } else {
    auto OptOffset = toSectionOffset(getUnitDIE().find(DW_AT_str_offsets_base));
    if (!OptOffset)
      return None;
    Offset = *OptOffset;
  }
  auto DescOrError = parseDWARFStringOffsetsTableHeader(DA, Header.getFormat(), Offset);
  if (!DescOrError)
    return DescOrError.takeError();
  return *DescOrError;
}